

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O0

void __thiscall QPicture::setData(QPicture *this,char *data,uint size)

{
  QPicturePrivate *pQVar1;
  longlong in_RSI;
  
  detach((QPicture *)0x319b55);
  pQVar1 = d_func((QPicture *)0x319b5f);
  QBuffer::setData((char *)&pQVar1->pictb,in_RSI);
  pQVar1 = d_func((QPicture *)0x319b80);
  QPicturePrivate::resetFormat(pQVar1);
  return;
}

Assistant:

void QPicture::setData(const char* data, uint size)
{
    detach();
    d_func()->pictb.setData(data, size);
    d_func()->resetFormat();                                // we'll have to check
}